

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O3

int mod2dense_forcibly_invert(mod2dense *m,mod2dense *r,int *a_row,int *a_col)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  mod2word **ppmVar4;
  mod2word *pmVar5;
  mod2word *pmVar6;
  int iVar7;
  int extraout_EAX;
  int iVar8;
  mod2sparse *pmVar9;
  mod2sparse *pmVar10;
  size_t sVar11;
  mod2sparse *pmVar12;
  uint uVar13;
  int row;
  ulong uVar14;
  ulong uVar15;
  int *piVar16;
  FILE *unaff_R14;
  long lVar17;
  int iStack_c4;
  mod2sparse *pmStack_c0;
  FILE *pFStack_b8;
  
  uVar2 = m->n_rows;
  pmVar12 = (mod2sparse *)(ulong)uVar2;
  if (uVar2 == m->n_cols) {
    if (r == m) goto LAB_00123957;
    if ((r->n_rows == uVar2) && (r->n_cols == uVar2)) {
      uVar3 = m->n_words;
      mod2dense_clear(r);
      if (0 < (int)uVar2) {
        uVar13 = 0;
        do {
          mod2dense_set(r,uVar13,uVar13,1);
          uVar13 = uVar13 + 1;
        } while (uVar2 != uVar13);
        if (0 < (int)uVar2) {
          pmVar9 = (mod2sparse *)0x0;
          do {
            a_row[(long)pmVar9] = -1;
            a_col[(long)pmVar9] = (int)pmVar9;
            pmVar9 = (mod2sparse *)((long)&pmVar9->n_rows + 1);
          } while (pmVar12 != pmVar9);
          if (0 < (int)uVar2) {
            pmVar9 = (mod2sparse *)0x0;
            do {
              iVar7 = (int)pmVar9;
              uVar14 = (ulong)pmVar9 >> 5 & 0x7ffffff;
              ppmVar4 = m->col;
              uVar13 = 1 << ((byte)pmVar9 & 0x1f);
              pmVar10 = pmVar9;
              do {
                if ((ppmVar4[(long)pmVar10][uVar14] & uVar13) != 0) {
                  if (uVar2 != (uint)pmVar10) {
                    pmVar10 = (mod2sparse *)((ulong)pmVar10 & 0xffffffff);
                    if (pmVar9 != pmVar10) {
                      pmVar5 = ppmVar4[(long)pmVar9];
                      ppmVar4[(long)pmVar9] = ppmVar4[(long)pmVar10];
                      m->col[(long)pmVar10] = pmVar5;
                      ppmVar4 = r->col;
                      pmVar5 = ppmVar4[(long)pmVar9];
                      ppmVar4[(long)pmVar9] = ppmVar4[(long)pmVar10];
                      r->col[(long)pmVar10] = pmVar5;
                      iVar7 = a_col[(long)pmVar9];
                      a_col[(long)pmVar9] = a_col[(long)pmVar10];
                      a_col[(long)pmVar10] = iVar7;
                    }
                    goto LAB_00123858;
                  }
                  break;
                }
                pmVar10 = (mod2sparse *)((long)&pmVar10->n_rows + 1);
              } while (pmVar12 != pmVar10);
              mod2dense_set(m,iVar7,iVar7,1);
              a_row[(long)pmVar9] = iVar7;
LAB_00123858:
              pmVar10 = (mod2sparse *)0x0;
              do {
                if (pmVar10 != pmVar9) {
                  pmVar5 = m->col[(long)pmVar10];
                  if ((pmVar5[uVar14] & uVar13) != 0) {
                    if ((int)uVar14 < (int)uVar3) {
                      pmVar6 = m->col[(long)pmVar9];
                      uVar15 = (ulong)pmVar9 >> 5;
                      do {
                        puVar1 = pmVar5 + uVar15;
                        *puVar1 = *puVar1 ^ pmVar6[uVar15];
                        uVar15 = uVar15 + 1;
                      } while ((uVar3 + (int)((ulong)pmVar9 >> 5)) - (int)uVar14 != uVar15);
                    }
                    if (0 < (int)uVar3) {
                      pmVar5 = r->col[(long)pmVar10];
                      pmVar6 = r->col[(long)pmVar9];
                      uVar15 = 0;
                      do {
                        puVar1 = pmVar5 + uVar15;
                        *puVar1 = *puVar1 ^ pmVar6[uVar15];
                        uVar15 = uVar15 + 1;
                      } while (uVar3 != uVar15);
                    }
                  }
                }
                pmVar10 = (mod2sparse *)((long)&pmVar10->n_rows + 1);
              } while (pmVar10 != pmVar12);
              pmVar9 = (mod2sparse *)((long)&pmVar9->n_rows + 1);
            } while (pmVar9 != pmVar12);
            if (0 < (int)uVar2) {
              pmVar9 = (mod2sparse *)0x0;
              iVar7 = 0;
              do {
                if (a_row[(long)pmVar9] != -1) {
                  a_row[iVar7] = a_row[(long)pmVar9];
                  a_col[iVar7] = a_col[(long)pmVar9];
                  iVar7 = iVar7 + 1;
                }
                pmVar9 = (mod2sparse *)((long)&pmVar9->n_rows + 1);
              } while (pmVar12 != pmVar9);
              return iVar7;
            }
          }
        }
      }
      return 0;
    }
    mod2dense_forcibly_invert_cold_2();
  }
  mod2dense_forcibly_invert_cold_1();
LAB_00123957:
  mod2dense_forcibly_invert_cold_3();
  if ((((FILE *)m)->_flags <= ((mod2sparse *)r)->n_rows) &&
     (pmVar12 = (mod2sparse *)r, unaff_R14 = (FILE *)m,
     *(int *)&((FILE *)m)->field_0x4 <= ((mod2sparse *)r)->n_cols)) {
    mod2dense_clear(r);
    iVar7 = ((FILE *)m)->_flags;
    if (0 < iVar7) {
      lVar17 = 0;
      do {
        piVar16 = *(int **)(((FILE *)m)->_IO_read_ptr + lVar17 * 0x38 + 0x10);
        if (-1 < *piVar16) {
          do {
            mod2dense_set(r,(int)lVar17,piVar16[1],1);
            piVar16 = *(int **)(piVar16 + 4);
          } while (-1 < *piVar16);
          iVar7 = ((FILE *)m)->_flags;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < iVar7);
    }
    return iVar7;
  }
  mod2sparse_to_dense_cold_1();
  if ((((FILE *)m)->_flags <= ((mod2sparse *)r)->n_rows) &&
     (pmVar12 = (mod2sparse *)r, unaff_R14 = (FILE *)m,
     *(int *)&((FILE *)m)->field_0x4 <= ((mod2sparse *)r)->n_cols)) {
    mod2sparse_clear((mod2sparse *)r);
    iVar7 = ((FILE *)m)->_flags;
    iVar8 = extraout_EAX;
    if (0 < iVar7) {
      iVar8 = *(int *)&((FILE *)m)->field_0x4;
      row = 0;
      do {
        if (0 < iVar8) {
          iVar7 = 0;
          do {
            iVar8 = mod2dense_get(m,row,iVar7);
            if (iVar8 != 0) {
              mod2sparse_insert((mod2sparse *)r,row,iVar7);
            }
            iVar7 = iVar7 + 1;
            iVar8 = *(int *)&((FILE *)m)->field_0x4;
          } while (iVar7 < iVar8);
          iVar7 = ((FILE *)m)->_flags;
        }
        row = row + 1;
      } while (row < iVar7);
    }
    return iVar8;
  }
  mod2dense_to_sparse_cold_1();
  lVar17 = 0;
  pmStack_c0 = pmVar12;
  pFStack_b8 = unaff_R14;
  do {
    sVar11 = fread((void *)((long)&iStack_c4 + lVar17),1,1,(FILE *)m);
    if (sVar11 != 1) {
      return 0;
    }
    lVar17 = lVar17 + 1;
  } while (lVar17 != 4);
  return iStack_c4;
}

Assistant:

int mod2dense_forcibly_invert 
( mod2dense *m, 	/* The matrix to find the inverse of (destroyed) */
  mod2dense *r,		/* Place to store the inverse */
  int *a_row,		/* Place to store row indexes of altered elements */
  int *a_col		/* Place to store column indexes of altered elements */
)
{
  mod2word *s, *t;
  int i, j, k, n, w, k0, b0;
  int u, c;

  if (mod2dense_rows(m)!=mod2dense_cols(m))
  { fprintf(stderr,
      "mod2dense_forcibly_invert: Matrix to invert is not square\n");
    exit(1);
  }

  if (r==m)
  { fprintf(stderr, 
      "mod2dense_forcibly_invert: Result matrix is the same as the operand\n");
    exit(1);
  }

  n = mod2dense_rows(m);
  w = m->n_words;

  if (mod2dense_rows(r)!=n || mod2dense_cols(r)!=n)
  { fprintf(stderr,
 "mod2dense_forcibly_invert: Matrix to receive inverse has wrong dimensions\n");
    exit(1);
  }

  mod2dense_clear(r);
  for (i = 0; i<n; i++) 
  { mod2dense_set(r,i,i,1);
  }

  for (i = 0; i<n; i++)
  { a_row[i] = -1;
    a_col[i] = i;
  }

  for (i = 0; i<n; i++)
  { 
    k0 = i >> mod2_wordsize_shift;
    b0 = i & mod2_wordsize_mask;

    for (j = i; j<n; j++) 
    { if (mod2_getbit(m->col[j][k0],b0)) break;
    }

    if (j==n)
    { j = i;
      mod2dense_set(m,i,j,1);
      a_row[i] = i;
    }

    if (j!=i)
    { 
      t = m->col[i];
      m->col[i] = m->col[j];
      m->col[j] = t;

      t = r->col[i];
      r->col[i] = r->col[j];
      r->col[j] = t;

      u = a_col[i];
      a_col[i] = a_col[j];
      a_col[j] = u;
    }

    for (j = 0; j<n; j++)
    { if (j!=i && mod2_getbit(m->col[j][k0],b0))
      { s = m->col[j];
        t = m->col[i];
        for (k = k0; k<w; k++) s[k] ^= t[k];
        s = r->col[j];
        t = r->col[i];
        for (k = 0; k<w; k++) s[k] ^= t[k];
      }
    }
  }

  c = 0;
  for (i = 0; i<n; i++)
  { if (a_row[i]!=-1)
    { a_row[c] = a_row[i];
      a_col[c] = a_col[i];
      c += 1;
    }
  }

  return c;
}